

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int dolibrary(lua_State *L,char *name)

{
  int iVar1;
  int status;
  char *name_local;
  lua_State *L_local;
  
  lua_getglobal(L,"require");
  lua_pushstring(L,name);
  iVar1 = docall(L,1,1);
  if (iVar1 == 0) {
    lua_setglobal(L,name);
  }
  iVar1 = report(L,iVar1);
  return iVar1;
}

Assistant:

static int dolibrary (lua_State *L, const char *name) {
  int status;
  lua_getglobal(L, "require");
  lua_pushstring(L, name);
  status = docall(L, 1, 1);  /* call 'require(name)' */
  if (status == LUA_OK)
    lua_setglobal(L, name);  /* global[name] = require return */
  return report(L, status);
}